

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

CSVError * __thiscall
duckdb::CSVError::InvalidState
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          idx_t current_column,LinesPerBoundary error_info,string *csv_row,idx_t row_byte_position,
          optional_idx byte_position,string *current_path)

{
  long lVar1;
  LinesPerBoundary error_info_p;
  ostringstream how_to_fix_it;
  ostringstream error;
  string local_380;
  string local_360;
  string local_340;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::ostringstream::ostringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "The CSV Parser state machine reached an invalid state.\nThis can happen when is not possible to parse your CSV File with the given options, or the CSV File is not RFC 4180 compliant "
             ,0xb5);
  ::std::__cxx11::ostringstream::ostringstream(local_320);
  if ((this->full_error_message).field_2._M_local_buf[1] == '\x01') {
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"Possible fixes:",0xf)
    ;
    local_380._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_380,1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,
               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
               ,0x76);
    local_380._M_dataplus._M_p._0_1_ = 10;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,(char *)&local_380,1);
  }
  ::std::__cxx11::stringbuf::str();
  lVar1 = *(long *)error_info.lines_in_batch;
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_360,lVar1,((long *)error_info.lines_in_batch)[1] + lVar1);
  ::std::__cxx11::stringbuf::str();
  error_info_p.lines_in_batch = error_info.boundary_idx;
  error_info_p.boundary_idx = current_column;
  CSVError(__return_storage_ptr__,&local_340,INVALID_STATE,(idx_t)options,&local_360,error_info_p,
           (idx_t)csv_row,(optional_idx)row_byte_position,(CSVReaderOptions *)this,&local_380,
           (string *)byte_position.index);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_380._M_dataplus._M_p._1_7_,local_380._M_dataplus._M_p._0_1_) !=
      &local_380.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_380._M_dataplus._M_p._1_7_,local_380._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  ::std::__cxx11::ostringstream::~ostringstream(local_320);
  ::std::ios_base::~ios_base(local_2b0);
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::InvalidState(const CSVReaderOptions &options, idx_t current_column, LinesPerBoundary error_info,
                                string &csv_row, idx_t row_byte_position, optional_idx byte_position,
                                const string &current_path) {
	std::ostringstream error;
	error << "The CSV Parser state machine reached an invalid state.\nThis can happen when is not possible to parse "
	         "your CSV File with the given options, or the CSV File is not RFC 4180 compliant ";
	std::ostringstream how_to_fix_it;
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		how_to_fix_it << "Possible fixes:" << '\n';
		how_to_fix_it << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not "
		                 "comply with the CSV standard."
		              << '\n';
	}
	return CSVError(error.str(), INVALID_STATE, current_column, csv_row, error_info, row_byte_position, byte_position,
	                options, how_to_fix_it.str(), current_path);
}